

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

FunctionCodeGenRuntimeData * __thiscall
Js::FunctionBody::GetInlineeCodeGenRuntimeDataForTargetInlinee
          (FunctionBody *this,ProfileId profiledCallSiteId,FunctionBody *inlineeFuncBody)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Type *pTVar4;
  FunctionCodeGenRuntimeData **ppFVar5;
  FunctionBody *pFVar6;
  FunctionBody *local_38;
  FunctionCodeGenRuntimeData *runtimeData;
  Type *codeGenRuntimeData;
  FunctionBody *inlineeFuncBody_local;
  ProfileId profiledCallSiteId_local;
  FunctionBody *this_local;
  
  if (this->profiledCallSiteCount <= profiledCallSiteId) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1a3a,"(profiledCallSiteId < profiledCallSiteCount)",
                                "profiledCallSiteId < profiledCallSiteCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pTVar4 = GetCodeGenRuntimeDataWithLock(this);
  if (pTVar4 == (Type *)0x0) {
    this_local = (FunctionBody *)0x0;
  }
  else {
    ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_FunctionCodeGenRuntimeData__
                        ((WriteBarrierPtr *)(pTVar4 + profiledCallSiteId));
    local_38 = (FunctionBody *)*ppFVar5;
    while( true ) {
      bVar2 = false;
      if (local_38 != (FunctionBody *)0x0) {
        pFVar6 = FunctionCodeGenRuntimeData::GetFunctionBody((FunctionCodeGenRuntimeData *)local_38)
        ;
        bVar2 = pFVar6 != inlineeFuncBody;
      }
      if (!bVar2) break;
      local_38 = (FunctionBody *)
                 FunctionCodeGenRuntimeData::GetNext((FunctionCodeGenRuntimeData *)local_38);
    }
    this_local = local_38;
  }
  return (FunctionCodeGenRuntimeData *)this_local;
}

Assistant:

const FunctionCodeGenRuntimeData *FunctionBody::GetInlineeCodeGenRuntimeDataForTargetInlinee(const ProfileId profiledCallSiteId, Js::FunctionBody *inlineeFuncBody) const
    {
        Assert(profiledCallSiteId < profiledCallSiteCount);

        auto codeGenRuntimeData = this->GetCodeGenRuntimeDataWithLock();
        if (!codeGenRuntimeData)
        {
            return nullptr;
        }
        const FunctionCodeGenRuntimeData *runtimeData = codeGenRuntimeData[profiledCallSiteId];
        while (runtimeData && runtimeData->GetFunctionBody() != inlineeFuncBody)
        {
            runtimeData = runtimeData->GetNext();
        }
        return runtimeData;
    }